

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::UnixTaskRunner::UnixTaskRunner(UnixTaskRunner *this)

{
  _Rb_tree_header *p_Var1;
  PlatformThreadId PVar2;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  (this->super_TaskRunner)._vptr_TaskRunner = (_func_int **)&PTR__UnixTaskRunner_00406a50;
  ThreadChecker::ThreadChecker(&this->thread_checker_);
  PVar2 = GetThreadId();
  this->created_thread_id_ = PVar2;
  EventFd::EventFd(&this->event_);
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->poll_fds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  (this->poll_fds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->poll_fds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_Deque_base
            (&(this->immediate_tasks_).
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->delayed_tasks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->quit_ = false;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->watch_tasks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->watch_tasks_changed_ = false;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:8207:39)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:8207:39)>
             ::_M_manager;
  (*(this->super_TaskRunner)._vptr_TaskRunner[4])(this,(ulong)(uint)(this->event_).event_handle_.t_)
  ;
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return;
}

Assistant:

UnixTaskRunner::UnixTaskRunner() {
  AddFileDescriptorWatch(event_.fd(), [] {
    // Not reached -- see PostFileDescriptorWatches().
    PERFETTO_DFATAL("Should be unreachable.");
  });
}